

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.cpp
# Opt level: O3

bool __thiscall Utility::Typer::type_next_character(Typer *this)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  
  if (this->string_pointer_ == (this->string_)._M_string_length) {
    return false;
  }
  do {
    uVar1 = try_type_next_character(this);
    if (uVar1 == 0) {
      this->phase_ = 0;
      sVar3 = this->string_pointer_ + 1;
      this->string_pointer_ = sVar3;
      if (sVar3 == (this->string_)._M_string_length) {
        return false;
      }
    }
    iVar2 = (*this->character_mapper_->_vptr_CharacterMapper[4])
                      (this->character_mapper_,(ulong)uVar1);
  } while ((char)iVar2 == '\0');
  return true;
}

Assistant:

bool Typer::type_next_character() {
	if(string_pointer_ == string_.size()) return false;

	while(true) {
		const uint16_t key_pressed = try_type_next_character();

		if(!key_pressed) {
			phase_ = 0;
			++string_pointer_;
			if(string_pointer_ == string_.size()) return false;
		}

		if(character_mapper_.needs_pause_after_key(key_pressed)) {
			break;
		}
	}

	return true;
}